

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int in_EAX;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  undefined1 uVar12;
  byte bVar13;
  byte *local_38;
  
  if (ptr == end) {
    return -1;
  }
  bVar4 = false;
  local_38 = (byte *)ptr;
LAB_0015f155:
  bVar2 = *local_38;
  if (bVar2 < 0xdc) {
    uVar12 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar12 = *(undefined1 *)((long)enc[1].scanners + (ulong)local_38[1]);
      }
      else {
LAB_0015f1a4:
        uVar12 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar12 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (local_38[1] < 0xfe)) goto LAB_0015f1a4;
    uVar12 = 0;
  }
  switch(uVar12) {
  case 5:
    if ((long)end - (long)local_38 < 2) {
      return -2;
    }
    break;
  case 6:
    if ((long)end - (long)local_38 < 3) {
      return -2;
    }
    break;
  case 7:
    if ((long)end - (long)local_38 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    pbVar7 = local_38;
    do {
      local_38 = pbVar7 + 2;
      iVar8 = 1;
      if (local_38 == (byte *)end) {
        in_EAX = -1;
      }
      else {
        bVar2 = *local_38;
        if (bVar2 < 0xdc) {
          uVar11 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar7[3]);
            }
            else {
LAB_0015f236:
              uVar11 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          uVar11 = 8;
        }
        else if ((bVar2 != 0xff) || (uVar11 = 0, pbVar7[3] < 0xfe)) goto LAB_0015f236;
        iVar8 = 6;
        if ((uVar11 != 0xe) &&
           ((0x15 < uVar11 || (iVar8 = 0, (0x200600U >> (uVar11 & 0x1f) & 1) == 0)))) {
          *nextTokPtr = (char *)local_38;
          in_EAX = 0;
          iVar8 = 1;
        }
      }
      pbVar7 = local_38;
    } while (iVar8 == 0);
    if (iVar8 != 6) {
      return in_EAX;
    }
  case 0xe:
    pbVar7 = local_38;
    do {
      local_38 = pbVar7 + 2;
      if (local_38 == (byte *)end) {
        in_EAX = -1;
        goto LAB_0015f317;
      }
      bVar2 = *local_38;
      if (bVar2 < 0xdc) {
        uVar11 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar7[3]);
          }
          else {
LAB_0015f2dc:
            uVar11 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar11 = 8;
      }
      else if ((bVar2 != 0xff) || (uVar11 = 0, pbVar7[3] < 0xfe)) goto LAB_0015f2dc;
      if ((uVar11 & 0xfffffffe) == 0xc) {
        local_38 = pbVar7 + 4;
        goto LAB_0015f3cb;
      }
      pbVar7 = local_38;
    } while ((uVar11 < 0x16) && ((0x200600U >> (uVar11 & 0x1f) & 1) != 0));
    goto LAB_0015f305;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0015f1be_caseD_16;
  case 0x17:
    if (bVar4) break;
    pbVar7 = local_38 + 2;
    if (pbVar7 == (byte *)end) {
      return -1;
    }
    bVar2 = *pbVar7;
    if (bVar2 < 0xdc) {
      bVar13 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar13 = *(byte *)((long)enc[1].scanners + (ulong)local_38[3]);
        }
        else {
LAB_0015f5a3:
          bVar13 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar13 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (local_38[3] < 0xfe)) goto LAB_0015f5a3;
      bVar13 = 0;
    }
    if (bVar13 < 0x16) {
      if (bVar13 == 5) {
        if ((long)end - (long)pbVar7 < 2) {
          return -2;
        }
      }
      else if (bVar13 == 6) {
        if ((long)end - (long)pbVar7 < 3) {
          return -2;
        }
      }
      else if ((bVar13 == 7) && ((long)end - (long)pbVar7 < 4)) {
        return -2;
      }
LAB_0015f856:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    if (((bVar13 != 0x16) && (bVar13 != 0x18)) &&
       ((bVar13 != 0x1d ||
        ((*(uint *)((long)namingBitmap +
                   (ulong)(local_38[3] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5))
          >> (local_38[3] & 0x1f) & 1) == 0)))) goto LAB_0015f856;
    local_38 = local_38 + 4;
    bVar4 = true;
    goto LAB_0015f323;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(local_38[1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5
                         )) >> (local_38[1] & 0x1f) & 1) == 0) break;
    goto switchD_0015f1be_caseD_16;
  }
  *nextTokPtr = (char *)local_38;
  return 0;
switchD_0015f1be_caseD_16:
  local_38 = local_38 + 2;
  goto LAB_0015f323;
LAB_0015f3cb:
  do {
    if (local_38 == (byte *)end) {
      iVar8 = -1;
LAB_0015f458:
      iVar9 = 1;
    }
    else {
      bVar2 = *local_38;
      if (bVar2 < 0xdc) {
        uVar5 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_38[1]);
          }
          else {
LAB_0015f42d:
            uVar5 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar5 = 8;
      }
      else if ((bVar2 != 0xff) || (uVar5 = 0, local_38[1] < 0xfe)) goto LAB_0015f42d;
      iVar9 = 0xc;
      iVar8 = in_EAX;
      if (uVar5 != uVar11) {
        switch(uVar5) {
        case 0:
        case 1:
        case 2:
        case 8:
          *nextTokPtr = (char *)local_38;
          iVar8 = 0;
          goto LAB_0015f458;
        case 3:
          iVar6 = big2_scanRef(enc,(char *)(local_38 + 2),end,(char **)&local_38);
          iVar9 = 0;
          if (iVar6 < 1) {
            if (iVar6 == 0) {
              *nextTokPtr = (char *)local_38;
            }
            iVar9 = 1;
            iVar8 = iVar6;
          }
          break;
        default:
switchD_0015f451_caseD_4:
          local_38 = local_38 + 2;
LAB_0015f4b1:
          iVar9 = 0;
          iVar8 = in_EAX;
          break;
        case 5:
          iVar9 = 1;
          iVar8 = -2;
          if (1 < (long)end - (long)local_38) goto switchD_0015f451_caseD_4;
          break;
        case 6:
          iVar9 = 1;
          iVar8 = -2;
          if (2 < (long)end - (long)local_38) {
            local_38 = local_38 + 3;
            goto LAB_0015f4b1;
          }
          break;
        case 7:
          iVar9 = 1;
          iVar8 = -2;
          if (3 < (long)end - (long)local_38) {
            local_38 = local_38 + 4;
            goto LAB_0015f4b1;
          }
        }
      }
    }
    in_EAX = iVar8;
  } while (iVar9 == 0);
  if (iVar9 != 0xc) {
    bVar3 = false;
    goto LAB_0015f319;
  }
  pbVar7 = local_38 + 2;
  pbVar1 = pbVar7;
  if (pbVar7 == (byte *)end) {
LAB_0015f7af:
    local_38 = pbVar1;
    bVar3 = false;
    in_EAX = -1;
  }
  else {
    bVar2 = *pbVar7;
    if (bVar2 < 0xdc) {
      uVar11 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_38[3]);
        }
        else {
LAB_0015f627:
          uVar11 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar11 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (local_38[3] < 0xfe)) goto LAB_0015f627;
      uVar11 = 0;
    }
    if (uVar11 < 0x11) {
      if (uVar11 - 9 < 2) {
LAB_0015f66b:
        pbVar1 = local_38 + 4;
        if (local_38 + 4 != (byte *)end) {
          pcVar10 = end + (-2 - (long)pbVar7);
          pbVar7 = local_38 + 6;
LAB_0015f686:
          local_38 = pbVar7;
          bVar2 = local_38[-2];
          if (bVar2 < 0xdc) {
            uVar12 = 7;
            if (3 < bVar2 - 0xd8) {
              if (bVar2 == 0) {
                uVar12 = *(undefined1 *)((long)enc[1].scanners + (ulong)local_38[-1]);
              }
              else {
LAB_0015f6d6:
                uVar12 = 0x1d;
              }
            }
          }
          else if (bVar2 - 0xdc < 4) {
            uVar12 = 8;
          }
          else {
            if ((bVar2 != 0xff) || (local_38[-1] < 0xfe)) goto LAB_0015f6d6;
            uVar12 = 0;
          }
          switch(uVar12) {
          case 5:
            if ((long)pcVar10 < 2) {
LAB_0015f731:
              local_38 = local_38 + -2;
              in_EAX = -2;
              goto LAB_0015f317;
            }
            break;
          case 6:
            if ((long)pcVar10 < 3) goto LAB_0015f731;
            break;
          case 7:
            if ((long)pcVar10 < 4) goto LAB_0015f731;
            break;
          default:
            pbVar7 = local_38 + -2;
            goto LAB_0015f305;
          case 9:
          case 10:
          case 0x15:
            goto switchD_0015f6ec_caseD_9;
          case 0xb:
            local_38 = local_38 + -2;
            goto LAB_0015f644;
          case 0x11:
            pbVar7 = local_38 + -2;
            goto LAB_0015f77a;
          case 0x16:
          case 0x18:
            goto LAB_0015f7ec;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(local_38[-1] >> 3 & 0x1c |
                                 (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)) >>
                 (local_38[-1] & 0x1f) & 1) != 0) {
LAB_0015f7ec:
              bVar3 = true;
              goto LAB_0015f319;
            }
            *nextTokPtr = (char *)(local_38 + -2);
            local_38 = local_38 + -2;
            goto LAB_0015f308;
          }
          in_EAX = 0;
          local_38 = local_38 + -2;
          *nextTokPtr = (char *)local_38;
          goto LAB_0015f317;
        }
        goto LAB_0015f7af;
      }
      local_38 = pbVar7;
      if (uVar11 == 0xb) {
LAB_0015f644:
        *nextTokPtr = (char *)(local_38 + 2);
        in_EAX = 1;
LAB_0015f317:
        bVar3 = false;
        goto LAB_0015f319;
      }
    }
    else if (uVar11 == 0x11) {
LAB_0015f77a:
      local_38 = pbVar7;
      pbVar1 = local_38 + 2;
      if (pbVar1 == (byte *)end) goto LAB_0015f7af;
      pbVar7 = pbVar1;
      if ((*pbVar1 == 0) && (local_38[3] == 0x3e)) {
        *nextTokPtr = (char *)(local_38 + 4);
        in_EAX = 3;
        local_38 = pbVar1;
        goto LAB_0015f317;
      }
    }
    else if (uVar11 == 0x15) goto LAB_0015f66b;
LAB_0015f305:
    local_38 = pbVar7;
    *nextTokPtr = (char *)local_38;
LAB_0015f308:
    bVar3 = false;
    in_EAX = 0;
  }
LAB_0015f319:
  bVar4 = false;
  if (!bVar3) {
    return in_EAX;
  }
LAB_0015f323:
  if (local_38 == (byte *)end) {
    return -1;
  }
  goto LAB_0015f155;
switchD_0015f6ec_caseD_9:
  pcVar10 = pcVar10 + -2;
  pbVar7 = local_38 + 2;
  pbVar1 = local_38;
  if (local_38 == (byte *)end) goto LAB_0015f7af;
  goto LAB_0015f686;
}

Assistant:

static
int PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          if (ptr == end)
            return XML_TOK_PARTIAL;
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            if (ptr == end)
              return XML_TOK_PARTIAL;
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}